

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O2

Expression * __thiscall
wasm::TranslateToFuzzReader::buildIf(TranslateToFuzzReader *this,ThreeArgs *args,Type type)

{
  If *pIVar1;
  optional<wasm::Type> type_00;
  
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 1;
  type_00.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload._M_value.id = (Type)(Type)type.id;
  pIVar1 = Builder::makeIf(&this->builder,args->a,args->b,args->c,type_00);
  return (Expression *)pIVar1;
}

Assistant:

Expression* TranslateToFuzzReader::buildIf(const struct ThreeArgs& args,
                                           Type type) {
  return builder.makeIf(args.a, args.b, args.c, type);
}